

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  cmGlobalGenerator *pcVar4;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  string local_150;
  undefined4 local_130;
  allocator local_129;
  string local_128;
  char *local_108;
  char *outdir;
  string local_f8;
  char *local_d8;
  char *config_outdir;
  string configPropStr;
  char *configProp;
  string configUpper;
  string conf;
  string local_58 [8];
  string propertyNameStr;
  char *propertyName;
  string *out_local;
  string *config_local;
  string *kind_local;
  cmGeneratorTarget *this_local;
  
  propertyNameStr.field_2._8_8_ = 0;
  std::__cxx11::string::string(local_58,(string *)kind);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=(local_58,"_OUTPUT_DIRECTORY");
    propertyNameStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),(string *)config);
  cmsys::SystemTools::UpperCase((string *)&configProp,(string *)((long)&configUpper.field_2 + 8));
  configPropStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&config_outdir,(string *)kind);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&config_outdir,"_OUTPUT_DIRECTORY_");
    std::__cxx11::string::operator+=((string *)&config_outdir,(string *)&configProp);
    configPropStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  uVar1 = configPropStr.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,(char *)uVar1,(allocator *)((long)&outdir + 7));
  pcVar3 = GetProperty(this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&outdir + 7));
  uVar1 = propertyNameStr.field_2._8_8_;
  local_d8 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,(char *)uVar1,&local_129);
    pcVar3 = GetProperty(this,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    local_108 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)out,pcVar3);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)out,pcVar3);
    std::__cxx11::string::operator=((string *)(configUpper.field_2._M_local_buf + 8),"");
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_150,out,pcVar3);
    std::__cxx11::string::operator=((string *)out,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar4 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"/",&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"",&local_199);
      (*pcVar4->_vptr_cmGlobalGenerator[0x12])
                (pcVar4,local_170,(undefined1 *)((long)&configUpper.field_2 + 8),local_198,out);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  local_130 = 1;
  std::__cxx11::string::~string((string *)&config_outdir);
  std::__cxx11::string::~string((string *)&configProp);
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  const char* propertyName = CM_NULLPTR;
  std::string propertyNameStr = kind;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = CM_NULLPTR;
  std::string configPropStr = kind;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = config_outdir;

    // Skip per-configuration subdirectory.
    conf = "";
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out = outdir;
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}